

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O0

int __thiscall tcmalloc::CentralFreeList::tc_length(CentralFreeList *this)

{
  int iVar1;
  int iVar2;
  SizeMap *this_00;
  SpinLockHolder local_18;
  SpinLockHolder h;
  CentralFreeList *this_local;
  
  h.lock_ = &this->lock_;
  SpinLockHolder::SpinLockHolder(&local_18,&this->lock_);
  iVar1 = this->used_slots_;
  this_00 = Static::sizemap();
  iVar2 = SizeMap::num_objects_to_move(this_00,(uint32_t)this->size_class_);
  SpinLockHolder::~SpinLockHolder(&local_18);
  return iVar1 * iVar2;
}

Assistant:

int CentralFreeList::tc_length() {
  SpinLockHolder h(&lock_);
  return used_slots_ * Static::sizemap()->num_objects_to_move(size_class_);
}